

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QtPrivate::QColorWell::dropEvent(QColorWell *this,QDropEvent *e)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  QDropEvent QVar4;
  int iVar5;
  LayoutDirection LVar6;
  undefined4 uVar7;
  ulong uVar8;
  QMetaType QVar9;
  uint uVar10;
  int iVar11;
  anon_union_24_3_e3d07ef4_for_data *paVar12;
  long in_FS_OFFSET;
  undefined8 uVar13;
  undefined8 uVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  QMetaType local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QMetaType local_68;
  undefined6 uStack_60;
  undefined2 uStack_5a;
  anon_union_24_3_e3d07ef4_for_data local_58;
  byte local_40;
  undefined7 uStack_3f;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  paVar12 = &local_58;
  QMimeData::colorData();
  local_80.d_ptr = &QMetaTypeInterfaceWrapper<QColor>::metaType;
  uVar8 = CONCAT71(uStack_3f,local_40) & 0xfffffffffffffffc;
  local_68.d_ptr._0_4_ = (int)uVar8;
  local_68.d_ptr._4_2_ = (undefined2)(uVar8 >> 0x20);
  local_68.d_ptr._6_2_ = (undefined2)(uVar8 >> 0x30);
  bVar3 = comparesEqual(&local_68,&local_80);
  if (bVar3) {
    uVar13 = local_58.shared;
    uVar15 = local_58._8_8_;
    if ((local_40 & 1) != 0) {
      uVar13 = *(long *)(local_58.shared + *(int *)(local_58.shared + 4));
      uVar15 = *(QMetaType **)(local_58.shared + *(int *)(local_58.shared + 4) + 8);
    }
    local_68.d_ptr._0_4_ = (int)uVar13;
    local_68.d_ptr._4_2_ = (undefined2)((ulong)uVar13 >> 0x20);
    local_68.d_ptr._6_2_ = (undefined2)((ulong)uVar13 >> 0x30);
    uStack_60 = (undefined6)uVar15;
    uStack_5a = (undefined2)((ulong)uVar15 >> 0x30);
  }
  else {
    uStack_5a = 0xaaaa;
    local_68.d_ptr._0_4_ = 0;
    local_68.d_ptr._4_2_ = 0xffff;
    local_68.d_ptr._6_2_ = 0;
    uStack_60 = 0;
    QVar9.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((local_40 & 1) != 0) {
      paVar12 = (anon_union_24_3_e3d07ef4_for_data *)
                (local_58.shared + *(int *)(local_58.shared + 4));
    }
    QMetaType::convert(QVar9,paVar12,local_80,&local_68);
  }
  local_78 = (undefined1 *)
             CONCAT26(local_68.d_ptr._6_2_,CONCAT24(local_68.d_ptr._4_2_,(int)local_68.d_ptr));
  uVar7 = (undefined4)(CONCAT26(uStack_5a,uStack_60) >> 0x20);
  puStack_70 = (undefined1 *)CONCAT26(puStack_70._6_2_,uStack_60);
  ::QVariant::~QVariant((QVariant *)&local_58);
  if ((int)local_78 == 0) {
    QVar4 = (QDropEvent)0x0;
  }
  else {
    auVar14._0_8_ =
         (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
         *(double *)(e + 0x10);
    auVar14._8_8_ =
         (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
         *(double *)(e + 0x18);
    auVar14 = minpd(_DAT_0066f5d0,auVar14);
    auVar16._8_8_ = -(ulong)(-2147483648.0 < auVar14._8_8_);
    auVar16._0_8_ = -(ulong)(-2147483648.0 < auVar14._0_8_);
    uVar10 = movmskpd(uVar7,auVar16);
    iVar11 = (int)auVar14._0_8_;
    if ((uVar10 & 1) == 0) {
      iVar11 = -0x80000000;
    }
    iVar5 = (int)auVar14._8_8_;
    if ((uVar10 & 2) == 0) {
      iVar5 = -0x80000000;
    }
    iVar1 = (this->super_QWellArray).cellh;
    LVar6 = QWidget::layoutDirection((QWidget *)this);
    if (LVar6 == RightToLeft) {
      iVar11 = ~(iVar11 / (this->super_QWellArray).cellw) + (this->super_QWellArray).ncols;
    }
    else {
      iVar11 = iVar11 / (this->super_QWellArray).cellw;
    }
    iVar2 = (this->super_QWellArray).nrows;
    uVar7 = QColor::rgb();
    local_80.d_ptr._0_4_ = uVar7;
    local_58.shared = (PrivateShared *)0x0;
    local_68.d_ptr._0_4_ = iVar11 * iVar2 + iVar5 / iVar1;
    local_58._8_8_ = &local_68;
    local_58._16_8_ = &local_80;
    QMetaObject::activate((QObject *)this,&QWellArray::staticMetaObject,2,&local_58.shared);
    QVar4 = (QDropEvent)0x1;
  }
  e[0xc] = QVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorWell::dropEvent(QDropEvent *e)
{
    QColor col = qvariant_cast<QColor>(e->mimeData()->colorData());
    if (col.isValid()) {
        int i = rowAt(e->position().toPoint().y()) + columnAt(e->position().toPoint().x()) * numRows();
        emit colorChanged(i, col.rgb());
        e->accept();
    } else {
        e->ignore();
    }
}